

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_constraints_unittest.cc
# Opt level: O0

void __thiscall
bssl::ParseNameConstraints_QuotedRfc822SanWithNoRfc822Constraints_Test::
~ParseNameConstraints_QuotedRfc822SanWithNoRfc822Constraints_Test
          (ParseNameConstraints_QuotedRfc822SanWithNoRfc822Constraints_Test *this)

{
  ~ParseNameConstraints_QuotedRfc822SanWithNoRfc822Constraints_Test
            ((ParseNameConstraints_QuotedRfc822SanWithNoRfc822Constraints_Test *)
             &this[-1].super_ParseNameConstraints.super_TestWithParam<std::tuple<bool>_>.super_Test.
              gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(ParseNameConstraints, QuotedRfc822SanWithNoRfc822Constraints) {
  // Load an unrelated (non-rfc822) constraint.
  std::string constraints_der;
  ASSERT_TRUE(
      LoadTestNameConstraint("othername-excluded.pem", &constraints_der));
  CertErrors errors;
  std::unique_ptr<NameConstraints> name_constraints(NameConstraints::Create(
      StringAsBytes(constraints_der), is_critical(), &errors));
  ASSERT_TRUE(name_constraints);

  std::string san_der;
  std::unique_ptr<GeneralNames> san;
  ASSERT_TRUE(
      LoadTestSubjectAltName("san-rfc822name-quoted.pem", &san, &san_der));
  // A rfc822 in SAN with quotes should be allowed since we only try to parse
  // the name if we are enforcing a constraint against it.
  EXPECT_TRUE(IsPermittedCert(name_constraints.get(), der::Input(), san.get()));
}